

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O2

bool __thiscall
cmUnsetCommand::InitialPass
          (cmUnsetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  pointer pbVar3;
  long lVar4;
  pointer pbVar5;
  allocator<char> local_39;
  string local_38;
  
  str1 = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == str1 || 0x40 < (ulong)((long)pbVar1 - (long)str1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"called with incorrect number of arguments",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
LAB_001f0a39:
    std::__cxx11::string::~string((string *)&local_38);
    bVar2 = false;
  }
  else {
    bVar2 = cmHasLiteralPrefix<std::__cxx11::string,5ul>(str1,(char (*) [5])"ENV{");
    if ((bVar2) && (5 < str1->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)str1);
      cmSystemTools::UnsetEnv(local_38._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar4 = (long)pbVar3 - (long)pbVar5 >> 5;
      if (lVar4 == 2) {
        bVar2 = std::operator==(pbVar5 + 1,"CACHE");
        if (!bVar2) {
          pbVar5 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_001f09e7;
        }
        cmMakefile::RemoveCacheDefinition((this->super_cmCommand).Makefile,str1);
      }
      else {
        if (lVar4 != 1) {
LAB_001f09e7:
          if ((long)pbVar3 - (long)pbVar5 == 0x40) {
            bVar2 = std::operator==(pbVar5 + 1,"PARENT_SCOPE");
            if (bVar2) {
              cmMakefile::RaiseScope((this->super_cmCommand).Makefile,str1,(char *)0x0);
              goto LAB_001f0a12;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"called with an invalid second argument",&local_39);
          cmCommand::SetError(&this->super_cmCommand,&local_38);
          goto LAB_001f0a39;
        }
        cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,str1);
      }
    }
LAB_001f0a12:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmUnsetCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus&)
{
  if (args.empty() || args.size() > 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  auto const& variable = args[0];

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& envVarName = variable.substr(4, variable.size() - 5);

#ifdef CMAKE_BUILD_WITH_CMAKE
    cmSystemTools::UnsetEnv(envVarName.c_str());
#endif
    return true;
  }
  // unset(VAR)
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // unset(VAR CACHE)
  if ((args.size() == 2) && (args[1] == "CACHE")) {
    this->Makefile->RemoveCacheDefinition(variable);
    return true;
  }
  // unset(VAR PARENT_SCOPE)
  if ((args.size() == 2) && (args[1] == "PARENT_SCOPE")) {
    this->Makefile->RaiseScope(variable, nullptr);
    return true;
  }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  this->SetError("called with an invalid second argument");
  return false;
}